

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBEx.cpp
# Opt level: O0

string * __thiscall ADSBfiConnection::GetURL_abi_cxx11_(ADSBfiConnection *this,positionTy *pos)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  positionTy *in_RDX;
  string *in_RDI;
  char url [128];
  allocator<char> *__a;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  allocator<char> local_99;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  positionTy *local_18;
  
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_18 = in_RDX;
  dVar1 = positionTy::lat(in_RDX);
  dVar2 = positionTy::lon(local_18);
  uVar3 = DataRefs::GetFdStdDistance_nm(&dataRefs);
  __a = (allocator<char> *)&local_98;
  snprintf((char *)__a,0x80,"https://opendata.adsb.fi/api/v2/lat/%f/lon/%f/dist/%d/",SUB84(dVar1,0),
           dVar2,(ulong)uVar3);
  __s = &local_99;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_stack_ffffffffffffff50,(char *)__s,__a);
  std::allocator<char>::~allocator(&local_99);
  return in_RDI;
}

Assistant:

std::string ADSBfiConnection::GetURL (const positionTy& pos)
{
    char url[128] = "";
    snprintf(url, sizeof(url), ADSBFI_URL, pos.lat(), pos.lon(),
             dataRefs.GetFdStdDistance_nm());
    return std::string(url);
}